

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

bool G_CheckSpot(int playernum,FPlayerStart *mthing)

{
  AActor *thing;
  bool bVar1;
  sector_t *psVar2;
  double dVar3;
  Self local_74;
  TVector2<double> local_70;
  TVector2<double> local_60;
  TVector2<double> local_50;
  uint local_3c;
  double dStack_38;
  int i;
  double oldz;
  DVector3 spot;
  FPlayerStart *mthing_local;
  int playernum_local;
  
  spot.Z = (double)mthing;
  TVector3<double>::TVector3((TVector3<double> *)&oldz);
  if (*(short *)((long)spot.Z + 0x1a) == 0) {
    mthing_local._7_1_ = false;
  }
  else {
    TVector3<double>::operator=((TVector3<double> *)&oldz,(TVector3<double> *)spot.Z);
    if ((level.flags & 0x8000000) == 0) {
      spot.Y = 0.0;
    }
    TVector2<double>::TVector2(&local_50,(TVector3<double> *)&oldz);
    psVar2 = P_PointInSector(&local_50);
    TVector2<double>::TVector2(&local_60,(TVector3<double> *)&oldz);
    dVar3 = secplane_t::ZatPoint(&psVar2->floorplane,&local_60);
    spot.Y = dVar3 + spot.Y;
    if ((&players)[(long)playernum * 0x54] == 0) {
      for (local_3c = 0; (int)local_3c < playernum; local_3c = local_3c + 1) {
        if ((&players)[(long)(int)local_3c * 0x54] != 0) {
          dVar3 = AActor::X((AActor *)(&players)[(long)(int)local_3c * 0x54]);
          if ((dVar3 == oldz) && (!NAN(dVar3) && !NAN(oldz))) {
            dVar3 = AActor::Y((AActor *)(&players)[(long)(int)local_3c * 0x54]);
            if ((dVar3 == spot.X) && (!NAN(dVar3) && !NAN(spot.X))) {
              return false;
            }
          }
        }
      }
      mthing_local._7_1_ = true;
    }
    else {
      dStack_38 = AActor::Z((AActor *)(&players)[(long)playernum * 0x54]);
      AActor::SetZ((AActor *)(&players)[(long)playernum * 0x54],spot.Y,true);
      TFlags<ActorFlag,_unsigned_int>::operator|=
                ((TFlags<ActorFlag,_unsigned_int> *)((&players)[(long)playernum * 0x54] + 0x18c),
                 MF_SOLID);
      thing = (AActor *)(&players)[(long)playernum * 0x54];
      TVector2<double>::TVector2(&local_70,(TVector3<double> *)&oldz);
      bVar1 = P_CheckPosition(thing,&local_70,false);
      local_3c = (uint)bVar1;
      operator~((EnumType)&local_74);
      TFlags<ActorFlag,_unsigned_int>::operator&=
                ((TFlags<ActorFlag,_unsigned_int> *)((&players)[(long)playernum * 0x54] + 0x18c),
                 &local_74);
      AActor::SetZ((AActor *)(&players)[(long)playernum * 0x54],dStack_38,true);
      if (local_3c == 0) {
        mthing_local._7_1_ = false;
      }
      else {
        mthing_local._7_1_ = true;
      }
    }
  }
  return mthing_local._7_1_;
}

Assistant:

bool G_CheckSpot (int playernum, FPlayerStart *mthing)
{
	DVector3 spot;
	double oldz;
	int i;

	if (mthing->type == 0) return false;

	spot = mthing->pos;

	if (!(level.flags & LEVEL_USEPLAYERSTARTZ))
	{
		spot.Z = 0;
	}
	spot.Z += P_PointInSector (spot)->floorplane.ZatPoint (spot);

	if (!players[playernum].mo)
	{ // first spawn of level, before corpses
		for (i = 0; i < playernum; i++)
			if (players[i].mo && players[i].mo->X() == spot.X && players[i].mo->Y() == spot.Y)
				return false;
		return true;
	}

	oldz = players[playernum].mo->Z();	// [RH] Need to save corpse's z-height
	players[playernum].mo->SetZ(spot.Z);		// [RH] Checks are now full 3-D

	// killough 4/2/98: fix bug where P_CheckPosition() uses a non-solid
	// corpse to detect collisions with other players in DM starts
	//
	// Old code:
	// if (!P_CheckPosition (players[playernum].mo, x, y))
	//    return false;

	players[playernum].mo->flags |=  MF_SOLID;
	i = P_CheckPosition(players[playernum].mo, spot);
	players[playernum].mo->flags &= ~MF_SOLID;
	players[playernum].mo->SetZ(oldz);	// [RH] Restore corpse's height
	if (!i)
		return false;

	return true;
}